

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool test3(void)

{
  allocator<int> *this;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  reference piVar2;
  bool local_152;
  int *x_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  int *x;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int local_f8 [8];
  iterator local_d8;
  size_type local_d0;
  undefined1 local_c8 [8];
  vector<int,_std::allocator<int>_> v2;
  int local_a8 [10];
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> v1;
  undefined1 local_48 [8];
  queue<int> b;
  queue<int> a;
  
  CP::queue<int>::queue((queue<int> *)&b.mFront);
  CP::queue<int>::queue((queue<int> *)local_48);
  local_a8[4] = 0xfffffffd;
  local_a8[5] = 9;
  local_a8[6] = 6;
  local_a8[0] = 1;
  local_a8[1] = 5;
  local_a8[2] = 4;
  local_a8[3] = 2;
  local_80 = local_a8;
  local_78 = 7;
  this = (allocator<int> *)
         ((long)&v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 7);
  std::allocator<int>::allocator(this);
  __l_00._M_len = local_78;
  __l_00._M_array = local_80;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_70,__l_00,this);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_f8[4] = 0xfffffffd;
  local_f8[5] = 9;
  local_f8[6] = 10000;
  local_f8[0] = 1;
  local_f8[1] = 5;
  local_f8[2] = 4;
  local_f8[3] = 2;
  local_d8 = local_f8;
  local_d0 = 7;
  std::allocator<int>::allocator((allocator<int> *)((long)&__range1 + 7));
  __l._M_len = local_d0;
  __l._M_array = local_d8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_c8,__l,
             (allocator<int> *)((long)&__range1 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&__range1 + 7));
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_70);
  x = (int *)std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_70);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &x);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    CP::queue<int>::push((queue<int> *)&b.mFront,piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_c8);
  x_1 = (int *)std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_c8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&x_1);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1_1);
    CP::queue<int>::push((queue<int> *)local_48,piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  bVar1 = CP::queue<int>::operator==((queue<int> *)&b.mFront,(queue<int> *)local_48);
  local_152 = false;
  if (!bVar1) {
    local_152 = CP::queue<int>::operator==((queue<int> *)local_48,(queue<int> *)&b.mFront);
    local_152 = !local_152;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  CP::queue<int>::~queue((queue<int> *)local_48);
  CP::queue<int>::~queue((queue<int> *)&b.mFront);
  return local_152;
}

Assistant:

bool test3() {
  CP::queue<int> a,b;
  std::vector<int> v1 = {1,5,4,2,-3,9,6};
  std::vector<int> v2 = {1,5,4,2,-3,9,10000};
  for (auto &x : v1) { a.push(x); }
  for (auto &x : v2) { b.push(x); }
  return ( ((a == b) == false)  && ((b == a) == false));
}